

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::LoadDynamicSection(cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer paVar1;
  cmELF *pcVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  lVar5 = (long)(this->super_cmELFInternal).DynamicSectionIndex;
  if (lVar5 < 0) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if ((this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (uint)(paVar1[lVar5].sh_size / paVar1[lVar5].sh_entsize);
      std::vector<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>::resize
                (&this->DynamicSectionEntries,(long)(int)uVar8);
      if (0 < (int)uVar8) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          std::istream::seekg((this->super_cmELFInternal).Stream,
                              paVar1[lVar5].sh_entsize * uVar6 + paVar1[lVar5].sh_offset,0);
          bVar3 = Read(this,(ELF_Dyn *)
                            ((long)&((this->DynamicSectionEntries).
                                     super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->d_tag + lVar7));
          if (!bVar3) {
            pcVar2 = (this->super_cmELFInternal).External;
            std::__cxx11::string::_M_replace
                      ((ulong)&pcVar2->ErrorMessage,0,
                       (char *)(pcVar2->ErrorMessage)._M_string_length,0x1b5c66);
            (this->super_cmELFInternal).ELFType = FileTypeInvalid;
            (this->super_cmELFInternal).DynamicSectionIndex = -1;
            return false;
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x10;
        } while (uVar6 < (uVar8 & 0x7fffffff));
      }
    }
  }
  return bVar4;
}

Assistant:

bool cmELFInternalImpl<Types>::LoadDynamicSection()
{
  // If there is no dynamic section we are done.
  if(this->DynamicSectionIndex < 0)
    {
    return false;
    }

  // If the section was already loaded we are done.
  if(!this->DynamicSectionEntries.empty())
    {
    return true;
    }

  // Allocate the dynamic section entries.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  int n = static_cast<int>(sec.sh_size / sec.sh_entsize);
  this->DynamicSectionEntries.resize(n);

  // Read each entry.
  for(int j=0; j < n; ++j)
    {
    // Seek to the beginning of the section entry.
    this->Stream.seekg(sec.sh_offset + sec.sh_entsize*j);
    ELF_Dyn& dyn = this->DynamicSectionEntries[j];

    // Try reading the entry.
    if(!this->Read(dyn))
      {
      this->SetErrorMessage("Error reading entry from DYNAMIC section.");
      this->DynamicSectionIndex = -1;
      return false;
      }
    }
  return true;
}